

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

shared_ptr<Map_Item> __thiscall
Map::AddItem(Map *this,short id,int amount,uchar x,uchar y,Character *from)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  World *pWVar3;
  Character *this_01;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  mapped_type *pmVar7;
  _Node *p_Var8;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _List_node_base *p_Var10;
  int iVar11;
  undefined6 in_register_00000032;
  Map *this_02;
  int num;
  int iVar12;
  shared_ptr<Map_Item> sVar13;
  Character *in_stack_00000008;
  PacketBuilder builder;
  undefined1 local_80 [48];
  key_type local_50;
  
  this_02 = (Map *)CONCAT62(in_register_00000032,id);
  iVar12 = 0;
  this->world = (World *)0x0;
  puVar6 = (undefined8 *)operator_new(0x28);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_001d39a0;
  *(undefined2 *)(puVar6 + 2) = 0;
  *(short *)((long)puVar6 + 0x12) = (short)amount;
  num = (int)CONCAT71(in_register_00000009,x);
  *(int *)((long)puVar6 + 0x14) = num;
  *(uchar *)(puVar6 + 3) = y;
  *(char *)((long)puVar6 + 0x19) = (char)from;
  *(undefined4 *)((long)puVar6 + 0x1c) = 0;
  puVar6[4] = 0;
  *(undefined8 **)&this->id = puVar6;
  this->world = (World *)(puVar6 + 2);
  if (in_stack_00000008 != (Character *)0x0) {
    p_Var10 = (this_02->items).
              super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    iVar11 = 0;
    if (p_Var10 != (_List_node_base *)&this_02->items) {
      iVar11 = 0;
      iVar12 = 0;
      do {
        p_Var2 = p_Var10[1]._M_next;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10[1]._M_prev;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (*(uchar *)&p_Var2->_M_prev == y) {
          iVar12 = iVar12 + (uint)(*(char *)((long)&p_Var2->_M_prev + 1) == (char)from);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        p_Var10 = p_Var10->_M_next;
        iVar11 = iVar11 + 1;
      } while (p_Var10 != (_List_node_base *)&this_02->items);
    }
    pWVar3 = this_02->world;
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxTile","");
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar3->config,(key_type *)local_80);
    iVar5 = util::variant::GetInt(pmVar7);
    bVar4 = true;
    _Var9._M_pi = extraout_RDX;
    if (iVar12 < iVar5) {
      pWVar3 = this_02->world;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MaxMap","");
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar3->config,&local_50);
      iVar12 = util::variant::GetInt(pmVar7);
      bVar4 = iVar12 <= iVar11;
      _Var9._M_pi = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        _Var9._M_pi = extraout_RDX_01;
      }
    }
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      _Var9._M_pi = extraout_RDX_02;
    }
    if (bVar4) goto LAB_001779ad;
  }
  iVar12 = GenerateItemID(this_02);
  *(short *)&this->world->last_character_id = (short)iVar12;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_80,PACKET_ITEM,PACKET_ADD,9);
  PacketBuilder::AddShort((PacketBuilder *)local_80,(int)(short)amount);
  PacketBuilder::AddShort((PacketBuilder *)local_80,(int)(short)this->world->last_character_id);
  PacketBuilder::AddThree((PacketBuilder *)local_80,num);
  PacketBuilder::AddChar((PacketBuilder *)local_80,(uint)y);
  PacketBuilder::AddChar((PacketBuilder *)local_80,(uint)from & 0xff);
  p_Var10 = (this_02->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var10 != (_List_node_base *)&this_02->characters) {
    do {
      this_01 = (Character *)p_Var10[1]._M_next;
      if (((in_stack_00000008 == (Character *)0x0) || (this_01 != in_stack_00000008)) &&
         (bVar4 = Character::InRange(this_01,(Map_Item *)this->world), bVar4)) {
        Character::Send(this_01,(PacketBuilder *)local_80);
      }
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)&this_02->characters);
  }
  p_Var8 = std::__cxx11::list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>>::
           _M_create_node<std::shared_ptr<Map_Item>const&>
                     ((list<std::shared_ptr<Map_Item>,std::allocator<std::shared_ptr<Map_Item>>> *)
                      &this_02->items,(shared_ptr<Map_Item> *)this);
  std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
  psVar1 = &(this_02->items).
            super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_80);
  _Var9._M_pi = extraout_RDX_03;
LAB_001779ad:
  sVar13.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var9._M_pi;
  sVar13.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Map_Item>)sVar13.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Map_Item> Map::AddItem(short id, int amount, unsigned char x, unsigned char y, Character *from)
{
	std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(0, id, amount, x, y, 0, 0));

	if (from || (from && from->SourceAccess() <= ADMIN_GM))
	{
		int ontile = 0;
		int onmap = 0;

		UTIL_FOREACH(this->items, item)
		{
			++onmap;
			if (item->x == x && item->y == y)
			{
				++ontile;
			}
		}

		if (ontile >= static_cast<int>(this->world->config["MaxTile"]) || onmap >= static_cast<int>(this->world->config["MaxMap"]))
		{
			return newitem;
		}
	}

	newitem->uid = GenerateItemID();

	PacketBuilder builder(PACKET_ITEM, PACKET_ADD, 9);
	builder.AddShort(id);
	builder.AddShort(newitem->uid);
	builder.AddThree(amount);
	builder.AddChar(x);
	builder.AddChar(y);

	UTIL_FOREACH(this->characters, character)
	{
		if ((from && character == from) || !character->InRange(*newitem))
		{
			continue;
		}

		character->Send(builder);
	}

	this->items.push_back(newitem);
	return newitem;
}